

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::RunContext::~RunContext(RunContext *this)

{
  ITracker *pIVar1;
  IEventListener *pIVar2;
  
  pIVar2 = (this->m_reporter).m_ptr;
  aborting(this);
  (*pIVar2->_vptr_IEventListener[0x11])();
  FatalConditionHandler::~FatalConditionHandler((FatalConditionHandler *)pIVar2);
  pIVar1 = (this->m_trackerContext).m_rootTracker.m_ptr;
  if (pIVar1 != (ITracker *)0x0) {
    (*pIVar1->_vptr_ITracker[1])();
  }
  std::
  _Vector_base<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
  ::~_Vector_base(&(this->m_activeSections).
                   super__Vector_base<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
                 );
  std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>::~vector
            (&this->m_unfinishedSections);
  std::vector<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>::~vector
            (&this->m_messageScopes);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::~vector(&this->m_messages);
  pIVar2 = (this->m_reporter).m_ptr;
  if (pIVar2 != (IEventListener *)0x0) {
    (*pIVar2->_vptr_IEventListener[1])();
  }
  Optional<Catch::AssertionResult>::reset(&this->m_lastResult);
  return;
}

Assistant:

RunContext::~RunContext() {
        m_reporter->testRunEnded(TestRunStats(m_runInfo, m_totals, aborting()));
    }